

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_add_for_class(_class *c)

{
  t_symbol *ptVar1;
  _class *c_local;
  
  ptVar1 = gensym("restore");
  class_addmethod(c,canvas_restore,ptVar1,A_GIMME,0);
  ptVar1 = gensym("click");
  class_addmethod(c,canvas_click,ptVar1,A_FLOAT,1,1,1,1,0);
  ptVar1 = gensym("dsp");
  class_addmethod(c,canvas_dsp,ptVar1,A_CANT,0);
  ptVar1 = gensym("map");
  class_addmethod(c,canvas_map,ptVar1,A_FLOAT,0);
  ptVar1 = gensym("setbounds");
  class_addmethod(c,canvas_setbounds,ptVar1,A_FLOAT,1,1,1,0);
  canvas_editor_for_class(c);
  canvas_readwrite_for_class(c);
  return;
}

Assistant:

void canvas_add_for_class(t_class *c)
{
    class_addmethod(c, (t_method)canvas_restore,
        gensym("restore"), A_GIMME, 0);
    class_addmethod(c, (t_method)canvas_click,
        gensym("click"), A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, 0);
    class_addmethod(c, (t_method)canvas_dsp,
        gensym("dsp"), A_CANT, 0);
    class_addmethod(c, (t_method)canvas_map,
        gensym("map"), A_FLOAT, A_NULL);
    class_addmethod(c, (t_method)canvas_setbounds,
        gensym("setbounds"), A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, A_NULL);
    canvas_editor_for_class(c);
    canvas_readwrite_for_class(c);
    /* g_graph_setup_class(c); */
}